

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O1

bool __thiscall raptor::TcpServer::SetExtendInfo(TcpServer *this,ConnectionId cid,uint64_t data)

{
  int iVar1;
  bool bVar2;
  shared_ptr<raptor::Connection> con;
  IAcceptor local_28;
  IEpollReceiver local_20;
  
  iVar1 = -1;
  if (((cid != 0xffffffffffffffff) && (this->_magic_number == (uint16_t)(cid >> 0x30))) &&
     (iVar1 = -1, (cid & 0xffffffff) < (this->_options).max_connections)) {
    iVar1 = (int)cid;
  }
  if (iVar1 == -1) {
    bVar2 = false;
  }
  else {
    GetConnection((TcpServer *)&stack0xffffffffffffffd8,(uint32_t)this);
    bVar2 = (Connection *)local_28._vptr_IAcceptor != (Connection *)0x0;
    if (bVar2) {
      Connection::SetExtendInfo((Connection *)local_28._vptr_IAcceptor,data);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver);
    }
  }
  return bVar2;
}

Assistant:

bool TcpServer::SetExtendInfo(ConnectionId cid, uint64_t data) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->SetExtendInfo(data);
        return true;
    }
    return false;
}